

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  Descriptor *pDVar2;
  OneofDescriptor *pOVar3;
  long lVar4;
  FieldGenerator *pFVar5;
  char *pcVar6;
  AlphaNum *a;
  FieldDescriptor *field;
  MessageGenerator *this_00;
  allocator local_1f1;
  Printer *local_1f0;
  Options *local_1e8;
  Iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  AlphaNum local_190;
  Iterator __end3;
  undefined1 local_150 [32];
  Formatter format;
  Formatter local_f8;
  Formatter local_c0;
  string local_88;
  SaveState saver;
  
  local_1f0 = printer;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()<>(&format,"// $classname$\n\n");
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = *(int *)(__begin3.descriptor + 4);
  local_1e8 = &this->options_;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar1 = operator!=(&__begin3,&__end3);
    if (!bVar1) break;
    field = (FieldDescriptor *)((long)__begin3.idx * 0x48 + *(long *)(__begin3.descriptor + 0x28));
    PrintFieldComment<google::protobuf::FieldDescriptor>(&format,field);
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SetCommonFieldVariables(field,&vars,local_1e8);
    Formatter::SaveState::SaveState(&saver,&format);
    Formatter::AddMap(&format,&vars);
    if ((~(byte)field[1] & 0x60) == 0) {
      bVar1 = IsImplicitWeakField(field,local_1e8,this->scc_analyzer_);
      pcVar6 = "";
      if (bVar1) {
        pDVar2 = FieldDescriptor::message_type(field);
        pcVar6 = ".weak";
        if (pDVar2 == (Descriptor *)0x0) {
          pcVar6 = "";
        }
      }
      local_190.piece_data_ = pcVar6;
      Formatter::operator()
                (&format,
                 "inline int $classname$::_internal_$name$_size() const {\n  return $name$_$1$.size();\n}\ninline int $classname$::$name$_size() const {\n$annotate_size$  return _internal_$name$_size();\n}\n"
                 ,&local_190.piece_data_);
    }
    else {
      pOVar3 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar3 == (OneofDescriptor *)0x0) {
        Formatter::Formatter(&local_c0,&format);
        GenerateSingularFieldHasBits(this,field,&local_c0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_c0.vars_._M_t);
      }
      else {
        std::__cxx11::string::string((string *)&local_190,"field_name",(allocator *)&local_88);
        UnderscoresToCamelCase((string *)local_150,*(string **)(field + 8),true);
        Formatter::Set<std::__cxx11::string>
                  (&format,(string *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string((string *)&local_190,"oneof_name",(allocator *)local_150);
        if (((byte)field[1] & 0x10) == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(field + 0x28);
        }
        Formatter::Set<std::__cxx11::string>
                  (&format,(string *)&local_190,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar4 + 8));
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string((string *)local_150,"oneof_index",&local_1f1);
        if (((byte)field[1] & 0x10) == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(field + 0x28);
        }
        strings::AlphaNum::AlphaNum
                  (&local_190,(int)((lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) / 0x28));
        StrCat_abi_cxx11_(&local_88,(protobuf *)&local_190,a);
        Formatter::Set<std::__cxx11::string>(&format,(string *)local_150,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        this_00 = (MessageGenerator *)local_150;
        std::__cxx11::string::~string((string *)local_150);
        GenerateOneofMemberHasBits(this_00,field,&format);
      }
    }
    bVar1 = anon_unknown_0::IsCrossFileMaybeMap(field);
    if (!bVar1) {
      Formatter::Formatter(&local_f8,&format);
      GenerateFieldClear(this,field,true,&local_f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_f8.vars_._M_t);
    }
    pFVar5 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,local_1f0);
    Formatter::operator()<>(&format,"\n");
    Formatter::SaveState::~SaveState(&saver);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    __begin3.idx = __begin3.idx + 1;
  }
  GenerateOneofHasBits(this,local_1f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldAccessorDefinitions(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("// $classname$\n\n");

  for (auto field : FieldRange(descriptor_)) {
    PrintFieldComment(format, field);

    if (IsFieldStripped(field, options_)) {
      continue;
    }

    std::map<std::string, std::string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    Formatter::SaveState saver(&format);
    format.AddMap(vars);

    // Generate has_$name$() or $name$_size().
    if (field->is_repeated()) {
      if (IsFieldStripped(field, options_)) {
        format(
            "inline int $classname$::$name$_size() const { "
            "__builtin_trap(); }\n");
      } else {
        format(
            "inline int $classname$::_internal_$name$_size() const {\n"
            "  return $name$_$1$.size();\n"
            "}\n"
            "inline int $classname$::$name$_size() const {\n"
            "$annotate_size$"
            "  return _internal_$name$_size();\n"
            "}\n",
            IsImplicitWeakField(field, options_, scc_analyzer_) &&
                    field->message_type()
                ? ".weak"
                : "");
      }
    } else if (field->real_containing_oneof()) {
      format.Set("field_name", UnderscoresToCamelCase(field->name(), true));
      format.Set("oneof_name", field->containing_oneof()->name());
      format.Set("oneof_index",
                 StrCat(field->containing_oneof()->index()));
      GenerateOneofMemberHasBits(field, format);
    } else {
      // Singular field.
      GenerateSingularFieldHasBits(field, format);
    }

    if (!IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, true, format);
    }

    // Generate type-specific accessors.
    if (!IsFieldStripped(field, options_)) {
      field_generators_.get(field).GenerateInlineAccessorDefinitions(printer);
    }

    format("\n");
  }

  // Generate has_$name$() and clear_has_$name$() functions for oneofs.
  GenerateOneofHasBits(printer);
}